

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::IsWindowHovered(ImGuiHoveredFlags flags)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *g;
  ImGuiWindow *pIVar2;
  
  if ((flags & 4U) != 0) {
    if (GImGui->HoveredWindow == (ImGuiWindow *)0x0) {
      return false;
    }
    goto LAB_00160b03;
  }
  pIVar2 = GImGui->HoveredWindow;
  switch(flags & 3) {
  case 0:
    pIVar1 = GImGui->CurrentWindow;
    break;
  case 1:
    if (pIVar2 == (ImGuiWindow *)0x0) {
      return false;
    }
    if (pIVar2->RootWindow != GImGui->CurrentWindow) {
      while (pIVar2 != GImGui->CurrentWindow) {
        pIVar2 = pIVar2->ParentWindow;
        if (pIVar2 == (ImGuiWindow *)0x0) {
          return false;
        }
      }
    }
    goto LAB_00160b03;
  case 2:
    pIVar1 = GImGui->CurrentWindow->RootWindowDockStop;
    break;
  case 3:
    if (pIVar2 == (ImGuiWindow *)0x0) {
      return false;
    }
    if (pIVar2->RootWindowDockStop != GImGui->CurrentWindow->RootWindowDockStop) {
      return false;
    }
    goto LAB_00160b03;
  }
  if (pIVar2 != pIVar1) {
    return false;
  }
LAB_00160b03:
  pIVar2 = GImGui->HoveredWindow;
  if (((((((GImGui->NavWindow == (ImGuiWindow *)0x0) ||
          (pIVar1 = GImGui->NavWindow->RootWindow, pIVar1 == (ImGuiWindow *)0x0)) ||
         (pIVar1->WasActive != true)) || (pIVar1 == pIVar2->RootWindow)) ||
       ((((uint)pIVar1->Flags >> 0x1b & 1) == 0 &&
        (((flags & 8U) != 0 || ((pIVar1->Flags & 0x4000000U) == 0)))))) &&
      ((pIVar2->Viewport == GImGui->MouseViewport ||
       ((GImGui->MovingWindow != (ImGuiWindow *)0x0 &&
        (pIVar2->RootWindow == GImGui->MovingWindow->RootWindow)))))) &&
     (((flags & 0x20U) != 0 ||
      (((GImGui->ActiveId == 0 || (GImGui->ActiveIdAllowOverlap != false)) ||
       (GImGui->ActiveId == pIVar2->MoveId)))))) {
    return true;
  }
  return false;
}

Assistant:

bool ImGui::IsWindowHovered(ImGuiHoveredFlags flags)
{
    IM_ASSERT((flags & ImGuiHoveredFlags_AllowWhenOverlapped) == 0);   // Flags not supported by this function
    ImGuiContext& g = *GImGui;

    if (flags & ImGuiHoveredFlags_AnyWindow)
    {
        if (g.HoveredWindow == NULL)
            return false;
    }
    else
    {
        switch (flags & (ImGuiHoveredFlags_RootWindow | ImGuiHoveredFlags_ChildWindows))
        {
        case ImGuiHoveredFlags_RootWindow | ImGuiHoveredFlags_ChildWindows:
            if (g.HoveredWindow == NULL || g.HoveredWindow->RootWindowDockStop != g.CurrentWindow->RootWindowDockStop)
                return false;
            break;
        case ImGuiHoveredFlags_RootWindow:
            if (g.HoveredWindow != g.CurrentWindow->RootWindowDockStop)
                return false;
            break;
        case ImGuiHoveredFlags_ChildWindows:
            if (g.HoveredWindow == NULL || !IsWindowChildOf(g.HoveredWindow, g.CurrentWindow))
                return false;
            break;
        default:
            if (g.HoveredWindow != g.CurrentWindow)
                return false;
            break;
        }
    }

    if (!IsWindowContentHoverable(g.HoveredWindow, flags))
        return false;
    if (!(flags & ImGuiHoveredFlags_AllowWhenBlockedByActiveItem))
        if (g.ActiveId != 0 && !g.ActiveIdAllowOverlap && g.ActiveId != g.HoveredWindow->MoveId)
            return false;
    return true;
}